

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O3

shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
 __thiscall mini_bus::MiniBusClient::keys_abi_cxx11_(MiniBusClient *this,string_view bucket)

{
  ostream *poVar1;
  char *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string_view command;
  shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  sVar2;
  string_view payload;
  __string_type buf;
  ostringstream oss;
  undefined1 local_1d0 [160];
  ios_base local_130 [264];
  
  command._M_len = bucket._M_len;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 0x30));
  local_1d0[0x10] = bucket._M_str._0_1_;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1d0 + 0x30),local_1d0 + 0x10,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,in_RCX,(long)bucket._M_str);
  std::__cxx11::stringbuf::str();
  command._M_str = (char *)0x4;
  payload._M_str = (char *)local_1d0._24_8_;
  payload._M_len = (size_t)"KEYS";
  send_simple_abi_cxx11_((MiniBusClient *)local_1d0,command,payload);
  operator>><std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_codehz[P]mini_bus_cpp_include_mini_bus_hpp:581:40)>
            ((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,(anon_class_1_0_00000001_for_func *)local_1d0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  if ((undefined1 *)CONCAT71(local_1d0._17_7_,local_1d0[0x10]) != local_1d0 + 0x20) {
    operator_delete((undefined1 *)CONCAT71(local_1d0._17_7_,local_1d0[0x10]),
                    (ulong)(local_1d0._32_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 0x30));
  std::ios_base::~ios_base(local_130);
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          )sVar2.
           super___shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::list<std::tuple<ACL, std::string>>>> keys(std::string_view bucket) {
    std::ostringstream oss;
    oss << (unsigned char) bucket.length() << bucket;
    auto buf = oss.str();
    return send_simple("KEYS", buf) >> [](std::optional<std::string> res) -> std::list<std::tuple<ACL, std::string>> {
      std::istringstream iss{*res};
      std::list<std::tuple<ACL, std::string>> ret;
      while (true) {
        ACL acl;
        unsigned char len;
        iss >> len;
        if (!iss) break;
        char buf[16] = {};
        iss.read(buf, len);
        if (strcmp(buf, "private") == 0)
          acl = ACL::Private;
        else if (strcmp(buf, "protected") == 0)
          acl = ACL::Protected;
        else if (strcmp(buf, "public") == 0)
          acl = ACL::Public;
        iss >> len;
        char key[256];
        iss.read(key, len);
        ret.emplace_back(acl, std::string{key, (size_t) len});
      }
      return ret;
    };
  }